

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_metadata.cc
# Opt level: O2

AttributeMetadata * __thiscall
draco::GeometryMetadata::GetAttributeMetadataByStringEntry
          (GeometryMetadata *this,string *entry_name,string *entry_value)

{
  pointer puVar1;
  AttributeMetadata *pAVar2;
  bool bVar3;
  __type _Var4;
  pointer puVar5;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar5 = (this->att_metadatas_).
           super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->att_metadatas_).
           super__Vector_base<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>,_std::allocator<std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar5 == puVar1) {
      return (AttributeMetadata *)0x0;
    }
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    bVar3 = Metadata::GetEntryString
                      (&((puVar5->_M_t).
                         super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                         .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl)->
                        super_Metadata,entry_name,&local_50);
    if ((bVar3) && (_Var4 = std::operator==(&local_50,entry_value), _Var4)) break;
    std::__cxx11::string::~string((string *)&local_50);
    puVar5 = puVar5 + 1;
  }
  pAVar2 = (puVar5->_M_t).
           super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
           .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
  std::__cxx11::string::~string((string *)&local_50);
  return pAVar2;
}

Assistant:

const AttributeMetadata *GeometryMetadata::GetAttributeMetadataByStringEntry(
    const std::string &entry_name, const std::string &entry_value) const {
  for (auto &&att_metadata : att_metadatas_) {
    std::string value;
    if (!att_metadata->GetEntryString(entry_name, &value)) {
      continue;
    }
    if (value == entry_value) {
      return att_metadata.get();
    }
  }
  // No attribute has the requested entry.
  return nullptr;
}